

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
vectors_difference(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v1,
                  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v2)

{
  iterator __first1;
  iterator __last1;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  __first2;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  in_RDX;
  back_insert_iterator<std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_> in_RSI;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_RDI;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_ffffffffffffff48;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  in_stack_ffffffffffffff58;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  in_stack_ffffffffffffff80;
  
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x279783);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin(in_stack_ffffffffffffff48)
  ;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end(in_stack_ffffffffffffff48);
  std::
  sort<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
            (in_RDX,in_stack_ffffffffffffff58);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin(in_stack_ffffffffffffff48)
  ;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end(in_stack_ffffffffffffff48);
  std::
  sort<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
            (in_RDX,in_stack_ffffffffffffff58);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin(in_stack_ffffffffffffff48)
  ;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end(in_stack_ffffffffffffff48);
  __first1 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin
                       (in_stack_ffffffffffffff48);
  __last1 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                      (in_stack_ffffffffffffff48);
  __first2._M_current =
       (VarId *)std::back_inserter<std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>
                          (in_stack_ffffffffffffff48);
  std::
  set_difference<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::back_insert_iterator<std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
            ((__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
              )__first1._M_current,
             (__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
              )__last1._M_current,__first2,in_stack_ffffffffffffff80,in_RSI);
  return in_RDI;
}

Assistant:

vector<mir::inst::VarId> vectors_difference(vector<mir::inst::VarId> v1,
                                            vector<mir::inst::VarId> v2) {
  vector<mir::inst::VarId> v;
  sort(v1.begin(), v1.end());
  sort(v2.begin(), v2.end());
  set_difference(v1.begin(), v1.end(), v2.begin(), v2.end(), back_inserter(v));
  return v;
}